

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  bool bVar1;
  int iVar2;
  XmlFormatting fmt;
  element_type *peVar3;
  string local_168;
  allocator<char> local_141;
  string local_140 [32];
  undefined1 local_120 [16];
  string local_110;
  allocator<char> local_e9;
  string local_e8 [32];
  undefined1 local_c8 [32];
  string local_a8;
  bool local_82;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ScopedElement e;
  TestCaseStats *testCaseStats_local;
  XmlReporter *this_local;
  
  e._8_8_ = testCaseStats;
  StreamingReporterBase<Catch::XmlReporter>::testCaseEnded
            (&this->super_StreamingReporterBase<Catch::XmlReporter>,testCaseStats);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"OverallResult",&local_49);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->m_xml,(XmlFormatting)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"success",&local_81);
  local_82 = Counts::allOk((Counts *)(e._8_8_ + 0xb8));
  XmlWriter::ScopedElement::writeAttribute<bool>((ScopedElement *)local_28,&local_80,&local_82);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_config);
  iVar2 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[0xb])();
  if (iVar2 == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"durationInSeconds",(allocator<char> *)(local_c8 + 0x1f));
    local_c8._16_8_ = Timer::getElapsedSeconds(&this->m_testCaseTimer);
    XmlWriter::ScopedElement::writeAttribute<double>
              ((ScopedElement *)local_28,&local_a8,(double *)(local_c8 + 0x10));
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)(local_c8 + 0x1f));
  }
  bVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (e._8_8_ + 0xe8));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e8,"StdOut",&local_e9);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_c8,(string *)&this->m_xml,(XmlFormatting)local_e8);
    trim((string *)(local_120 + 0x10),(string *)(e._8_8_ + 0xe8));
    XmlWriter::ScopedElement::writeText
              ((ScopedElement *)local_c8,(string *)(local_120 + 0x10),Newline);
    std::__cxx11::string::~string((string *)(local_120 + 0x10));
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_c8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
  }
  bVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (e._8_8_ + 0x108));
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_140,"StdErr",&local_141);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_120,(string *)&this->m_xml,(XmlFormatting)local_140)
    ;
    trim(&local_168,(string *)(e._8_8_ + 0x108));
    XmlWriter::ScopedElement::writeText((ScopedElement *)local_120,&local_168,Newline);
    std::__cxx11::string::~string((string *)&local_168);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_120);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  fmt = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,fmt);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  return;
}

Assistant:

void XmlReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        StreamingReporterBase::testCaseEnded( testCaseStats );
        XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
        e.writeAttribute( "success", testCaseStats.totals.assertions.allOk() );

        if ( m_config->showDurations() == ShowDurations::Always )
            e.writeAttribute( "durationInSeconds", m_testCaseTimer.getElapsedSeconds() );

        if( !testCaseStats.stdOut.empty() )
            m_xml.scopedElement( "StdOut" ).writeText( trim( testCaseStats.stdOut ), XmlFormatting::Newline );
        if( !testCaseStats.stdErr.empty() )
            m_xml.scopedElement( "StdErr" ).writeText( trim( testCaseStats.stdErr ), XmlFormatting::Newline );

        m_xml.endElement();
    }